

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O3

bool __thiscall
slang::DiagnosticEngine::issueImpl
          (DiagnosticEngine *this,Diagnostic *diagnostic,DiagnosticSeverity severity)

{
  flat_hash_set<BufferID> *this_00;
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  pointer pSVar4;
  pointer pSVar5;
  SourceManager *this_01;
  path *ppVar6;
  pointer psVar7;
  element_type *peVar8;
  Diagnostic *pDVar9;
  bool bVar10;
  DiagnosticSeverity DVar11;
  SourceLocation SVar12;
  path *ppVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong hash;
  ulong uVar18;
  path *pattern;
  long lVar19;
  path *ppVar20;
  pointer psVar21;
  undefined1 uVar22;
  __extent_storage<18446744073709551615UL> _Var23;
  Diagnostic *note;
  Diagnostic *diagnostic_00;
  bool bVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  undefined1 auVar29 [16];
  span<const_slang::SourceRange,_18446744073709551615UL> ranges;
  SourceLocation loc;
  string message;
  SmallVector<slang::SourceLocation,_8UL> expansionLocs;
  locator res;
  SourceLocation local_178;
  ulong local_170;
  DiagnosticSeverity local_164;
  string local_160;
  SmallVectorBase<slang::SourceLocation> local_140 [2];
  ulong local_e8;
  undefined1 local_e0 [32];
  long local_c0;
  SourceLocation local_b8;
  size_type local_b0;
  undefined8 local_a8;
  DiagnosticSeverity local_a0;
  undefined1 local_9c;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  local_140[0].data_ = (pointer)local_140[0].firstElement;
  local_140[0].len = 0;
  local_140[0].cap = 8;
  local_178 = diagnostic->location;
  uVar22 = 0;
  local_164 = severity;
  if (local_178 == (SourceLocation)0xffffffffffffffff) {
    local_170 = 0;
  }
  else {
    local_170 = 0;
    while (bVar10 = SourceManager::isMacroLoc(this->sourceManager,local_178), SVar12 = local_178,
          bVar10) {
      bVar10 = SourceManager::isMacroArgLoc(this->sourceManager,local_178);
      if (bVar10) {
        local_e0._0_8_ = SourceManager::getExpansionLoc(this->sourceManager,local_178);
        SmallVectorBase<slang::SourceLocation>::emplace_back<slang::SourceLocation>
                  (local_140,(SourceLocation *)local_e0);
        local_178 = SourceManager::getOriginalLoc(this->sourceManager,local_178);
      }
      else {
        SmallVectorBase<slang::SourceLocation>::emplace_back<slang::SourceLocation_const&>
                  (local_140,&local_178);
        local_178 = SourceManager::getExpansionLoc(this->sourceManager,local_178);
      }
      pSVar4 = (diagnostic->ranges).
               super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar5 = (diagnostic->ranges).
               super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
               super__Vector_impl_data._M_finish;
      this_01 = this->sourceManager;
      bVar10 = SourceManager::isMacroArgLoc(this_01,SVar12);
      if (bVar10) {
        SVar12 = SourceManager::getExpansionLoc(this_01,SVar12);
        _Var23._M_extent_value = (long)pSVar5 - (long)pSVar4 >> 4;
        local_e0._0_8_ = local_e0 + 0x18;
        local_e0._8_8_ = (pointer)0x0;
        local_e0._16_8_ = (BufferID *)0x8;
        ranges._M_extent._M_extent_value = _Var23._M_extent_value;
        ranges._M_ptr = pSVar4;
        mapSourceRanges(this,SVar12,ranges,(SmallVectorBase<slang::SourceRange> *)local_e0,false);
        if ((ulong)local_e0._8_8_ < _Var23._M_extent_value) {
LAB_002d7b34:
          bVar10 = false;
        }
        else {
          bVar10 = true;
          if ((pointer)local_e0._8_8_ != (pointer)0x0) {
            uVar14 = (ulong)SVar12 >> 0x1c;
            uVar15 = SVar12._0_4_ & 0xfffffff;
            SVar12 = (SourceLocation)local_e0._0_8_;
            do {
              uVar17 = (uint)*(ulong *)SVar12 & 0xfffffff;
              bVar24 = uVar15 < uVar17;
              if (((uVar15 != uVar17) ||
                  (uVar16 = *(ulong *)SVar12 >> 0x1c, bVar24 = uVar14 < uVar16, uVar14 != uVar16))
                 && (bVar24)) goto LAB_002d7b34;
              uVar17 = (uint)*(ulong *)((long)SVar12 + 8) & 0xfffffff;
              bVar24 = uVar15 < uVar17;
              if (((uVar15 == uVar17) &&
                  (uVar16 = *(ulong *)((long)SVar12 + 8) >> 0x1c, bVar24 = uVar14 < uVar16,
                  uVar14 == uVar16)) || (-1 < (char)(-bVar24 | 1U))) goto LAB_002d7b34;
              SVar12 = (SourceLocation)((long)SVar12 + 0x10);
            } while (SVar12 != (SourceLocation)(local_e0._8_8_ * 0x10 + local_e0._0_8_));
          }
        }
        if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x18) {
          operator_delete((void *)local_e0._0_8_);
        }
        if (bVar10) {
          local_170 = local_140[0].len;
        }
      }
    }
    local_160._M_dataplus._M_p._0_4_ = local_178._0_4_ & 0xfffffff;
    this_00 = &this->reportedIncludeStack;
    hash = SUB168(ZEXT416((uint)local_160._M_dataplus._M_p) * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(ZEXT416((uint)local_160._M_dataplus._M_p) * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar16 = hash >> ((byte)(this->reportedIncludeStack).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                            .arrays.groups_size_index & 0x3f);
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    local_e8 = (this->reportedIncludeStack).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
               .arrays.groups_size_mask;
    uVar18 = 0;
    uVar14 = uVar16;
    do {
      pgVar2 = (this->reportedIncludeStack).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
               .arrays.groups_ + uVar14;
      local_48 = pgVar2->m[0].n;
      uStack_47 = pgVar2->m[1].n;
      uStack_46 = pgVar2->m[2].n;
      bStack_45 = pgVar2->m[3].n;
      uStack_44 = pgVar2->m[4].n;
      uStack_43 = pgVar2->m[5].n;
      uStack_42 = pgVar2->m[6].n;
      bStack_41 = pgVar2->m[7].n;
      uStack_40 = pgVar2->m[8].n;
      uStack_3f = pgVar2->m[9].n;
      uStack_3e = pgVar2->m[10].n;
      bStack_3d = pgVar2->m[0xb].n;
      uStack_3c = pgVar2->m[0xc].n;
      uStack_3b = pgVar2->m[0xd].n;
      uStack_3a = pgVar2->m[0xe].n;
      bStack_39 = pgVar2->m[0xf].n;
      uVar25 = (uchar)uVar3;
      auVar29[0] = -(local_48 == uVar25);
      uVar26 = (uchar)((uint)uVar3 >> 8);
      auVar29[1] = -(uStack_47 == uVar26);
      uVar27 = (uchar)((uint)uVar3 >> 0x10);
      auVar29[2] = -(uStack_46 == uVar27);
      bVar28 = (byte)((uint)uVar3 >> 0x18);
      auVar29[3] = -(bStack_45 == bVar28);
      auVar29[4] = -(uStack_44 == uVar25);
      auVar29[5] = -(uStack_43 == uVar26);
      auVar29[6] = -(uStack_42 == uVar27);
      auVar29[7] = -(bStack_41 == bVar28);
      auVar29[8] = -(uStack_40 == uVar25);
      auVar29[9] = -(uStack_3f == uVar26);
      auVar29[10] = -(uStack_3e == uVar27);
      auVar29[0xb] = -(bStack_3d == bVar28);
      auVar29[0xc] = -(uStack_3c == uVar25);
      auVar29[0xd] = -(uStack_3b == uVar26);
      auVar29[0xe] = -(uStack_3a == uVar27);
      auVar29[0xf] = -(bStack_39 == bVar28);
      for (uVar15 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe); uVar15 != 0;
          uVar15 = uVar15 - 1 & uVar15) {
        uVar17 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
          }
        }
        if ((uint)local_160._M_dataplus._M_p ==
            (this->reportedIncludeStack).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
            .arrays.elements_[uVar14 * 0xf + (ulong)uVar17].id) {
          uVar22 = 0;
          goto LAB_002d7d2a;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_39) == 0) break;
      lVar19 = uVar14 + uVar18;
      uVar18 = uVar18 + 1;
      uVar14 = lVar19 + 1U & local_e8;
    } while (uVar18 <= local_e8);
    if ((this->reportedIncludeStack).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
        .size_ctrl.size <
        (this->reportedIncludeStack).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
      ::nosize_unchecked_emplace_at<slang::BufferID>
                ((locator *)local_e0,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                  *)this_00,(arrays_type *)this_00,uVar16,hash,(BufferID *)&local_160);
      psVar1 = &(this->reportedIncludeStack).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
      ::unchecked_emplace_with_rehash<slang::BufferID>
                ((locator *)local_e0,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                  *)this_00,hash,(BufferID *)&local_160);
    }
    uVar22 = 1;
LAB_002d7d2a:
    DVar11 = getDefaultSeverity(diagnostic->code);
    if (DVar11 == Warning) {
      if ((this->ignoreWarnPatterns).
          super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->ignoreWarnPatterns).
          super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ppVar13 = SourceManager::getFullPath_abi_cxx11_
                            (this->sourceManager,(BufferID)(local_178._0_4_ & 0xfffffff));
        ppVar6 = (this->ignoreWarnPatterns).
                 super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar20 = (this->ignoreWarnPatterns).
                       super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppVar20 != ppVar6;
            ppVar20 = ppVar20 + 1) {
          bVar10 = svGlobMatches(ppVar13,ppVar20);
          if (bVar10) goto LAB_002d7f61;
        }
      }
      if (((local_170 < local_140[0].len) &&
          ((this->ignoreMacroWarnPatterns).
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (this->ignoreMacroWarnPatterns).
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_finish)) &&
         (SVar12 = SourceManager::getFullyOriginalLoc
                             (this->sourceManager,local_140[0].data_[local_170]),
         (this->ignoreMacroWarnPatterns).
         super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->ignoreMacroWarnPatterns).
         super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        ppVar13 = SourceManager::getFullPath_abi_cxx11_
                            (this->sourceManager,(BufferID)(SVar12._0_4_ & 0xfffffff));
        ppVar6 = (this->ignoreMacroWarnPatterns).
                 super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar20 = (this->ignoreMacroWarnPatterns).
                       super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppVar20 != ppVar6;
            ppVar20 = ppVar20 + 1) {
          bVar10 = svGlobMatches(ppVar13,ppVar20);
          if (bVar10) goto LAB_002d7f61;
        }
      }
    }
  }
  formatMessage_abi_cxx11_(&local_160,this,diagnostic);
  local_e0._16_8_ = local_140[0].len - local_170;
  local_e0._8_8_ = local_140[0].data_ + local_170;
  local_e0._24_8_ =
       (diagnostic->ranges).
       super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_c0 = (long)(diagnostic->ranges).
                   super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
                   _M_impl.super__Vector_impl_data._M_finish - local_e0._24_8_ >> 4;
  local_b8 = local_178;
  local_a0 = local_164;
  local_a8 = CONCAT44(local_160._M_dataplus._M_p._4_4_,(uint)local_160._M_dataplus._M_p);
  local_b0 = local_160._M_string_length;
  psVar21 = (this->clients).
            super__Vector_base<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar7 = (this->clients).
           super__Vector_base<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_e0._0_8_ = diagnostic;
  local_9c = uVar22;
  if (psVar21 != psVar7) {
    do {
      peVar8 = (psVar21->super___shared_ptr<slang::DiagnosticClient,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*peVar8->_vptr_DiagnosticClient[2])(peVar8,local_e0);
      psVar21 = psVar21 + 1;
    } while (psVar21 != psVar7);
  }
  pDVar9 = (diagnostic->notes).
           super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (diagnostic_00 =
            (diagnostic->notes).
            super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
            super__Vector_impl_data._M_start; diagnostic_00 != pDVar9;
      diagnostic_00 = diagnostic_00 + 1) {
    if (((diagnostic_00->location != (SourceLocation)0xffffffffffffffff) ||
        (diagnostic_00->code == (DiagCode)0xe70006)) || (diagnostic_00->code == (DiagCode)0x80001))
    {
      issue(this,diagnostic_00);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_160._M_dataplus._M_p._4_4_,(uint)local_160._M_dataplus._M_p) !=
      &local_160.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_160._M_dataplus._M_p._4_4_,(uint)local_160._M_dataplus._M_p),
                    local_160.field_2._M_allocated_capacity + 1);
  }
  bVar10 = true;
LAB_002d7f39:
  if (local_140[0].data_ != (pointer)local_140[0].firstElement) {
    operator_delete(local_140[0].data_);
  }
  return bVar10;
LAB_002d7f61:
  bVar10 = false;
  goto LAB_002d7f39;
}

Assistant:

bool DiagnosticEngine::issueImpl(const Diagnostic& diagnostic, DiagnosticSeverity severity) {
    // Walk out until we find a location for this diagnostic that isn't inside a macro.
    SmallVector<SourceLocation, 8> expansionLocs;
    SourceLocation loc = diagnostic.location;
    size_t ignoreExpansionsUntil = 0;
    bool showIncludeStack = false;

    if (loc != SourceLocation::NoLocation) {
        while (sourceManager.isMacroLoc(loc)) {
            SourceLocation prevLoc = loc;
            if (sourceManager.isMacroArgLoc(loc)) {
                expansionLocs.push_back(sourceManager.getExpansionLoc(loc));
                loc = sourceManager.getOriginalLoc(loc);
            }
            else {
                expansionLocs.push_back(loc);
                loc = sourceManager.getExpansionLoc(loc);
            }

            if (checkMacroArgRanges(*this, prevLoc, diagnostic.ranges))
                ignoreExpansionsUntil = expansionLocs.size();
        }

        showIncludeStack = reportedIncludeStack.emplace(loc.buffer()).second;

        auto checkSuppressed = [&](const std::vector<fs::path>& patterns, SourceLocation loc) {
            if (patterns.empty())
                return false;

            auto& path = sourceManager.getFullPath(loc.buffer());
            for (auto& pattern : patterns) {
                if (svGlobMatches(path, pattern))
                    return true;
            }
            return false;
        };

        if (getDefaultSeverity(diagnostic.code) == DiagnosticSeverity::Warning) {
            if (checkSuppressed(ignoreWarnPatterns, loc))
                return false;

            if (ignoreExpansionsUntil < expansionLocs.size() && !ignoreMacroWarnPatterns.empty()) {
                auto originalLoc = sourceManager.getFullyOriginalLoc(
                    expansionLocs[ignoreExpansionsUntil]);

                if (checkSuppressed(ignoreMacroWarnPatterns, originalLoc))
                    return false;
            }
        }
    }

    std::string message = formatMessage(diagnostic);

    ReportedDiagnostic report(diagnostic);
    report.expansionLocs = std::span<SourceLocation>(expansionLocs).subspan(ignoreExpansionsUntil);
    report.ranges = diagnostic.ranges;
    report.location = loc;
    report.severity = severity;
    report.formattedMessage = message;
    report.shouldShowIncludeStack = showIncludeStack;

    for (auto& client : clients)
        client->report(report);

    // Notes are ignored if location is "NoLocation" since they frequently make no
    // sense without location information.
    for (const Diagnostic& note : diagnostic.notes) {
        // At some point we should figure out how to not hardcode these special cases
        // that allow notes to be issued without a location.
        if (note.location != SourceLocation::NoLocation || note.code == diag::NoteFromHere2 ||
            note.code == diag::NoteUdpCoverage) {
            issue(note);
        }
    }

    return true;
}